

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall FlowGraph::AddBlockToLoop(FlowGraph *this,BasicBlock *block,Loop *loop)

{
  ushort uVar1;
  BasicBlock *local_20;
  BasicBlock *block_local;
  
  local_20 = block;
  SList<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Prepend(&loop->blockList,&local_20);
  uVar1 = *(ushort *)&local_20->field_0x18;
  if ((uVar1 & 8) != 0) {
    Loop::SetHasCall(loop);
    uVar1 = *(ushort *)&local_20->field_0x18;
  }
  if ((uVar1 & 0x10) != 0) {
    Loop::SetHasYield(loop);
  }
  return;
}

Assistant:

void
FlowGraph::AddBlockToLoop(BasicBlock *block, Loop *loop)
{
    loop->blockList.Prepend(block);
    if (block->hasCall)
    {
        loop->SetHasCall();
    }
    if (block->hasYield)
    {
        loop->SetHasYield();
    }
}